

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

void t1_decode_cblk_v2(opj_t1_t *t1,opj_tcd_cblk_dec_v2_t *cblk,OPJ_UINT32 orient,
                      OPJ_UINT32 roishift,OPJ_UINT32 cblksty)

{
  long lVar1;
  uint uVar2;
  opj_bool oVar3;
  opj_mqc_t *mqc_00;
  int in_ECX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  char cVar4;
  opj_tcd_seg_t *seg;
  OPJ_BYTE type;
  OPJ_UINT32 passno;
  OPJ_UINT32 segno;
  OPJ_UINT32 passtype;
  OPJ_INT32 bpno;
  opj_mqc_t *mqc;
  opj_raw_t *raw;
  int in_stack_00000058;
  int in_stack_0000005c;
  opj_t1_t *in_stack_00000060;
  uint in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  undefined8 in_stack_ffffffffffffffb0;
  uint7 in_stack_ffffffffffffffb8;
  uint local_40;
  uint local_3c;
  uint local_38;
  int local_34;
  opj_mqc_t *mqc_01;
  opj_raw_t *raw_00;
  OPJ_INT32 bpno_00;
  undefined4 in_stack_ffffffffffffffe0;
  
  raw_00 = *(opj_raw_t **)(in_RDI + 0x10);
  mqc_01 = *(opj_mqc_t **)(in_RDI + 8);
  oVar3 = allocate_buffers((opj_t1_t *)(ulong)in_stack_ffffffffffffffb8,
                           (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                           (int)in_stack_ffffffffffffffb0);
  if (oVar3 != 0) {
    local_34 = in_ECX + *(int *)(in_RSI + 0x20) + -1;
    local_38 = 2;
    mqc_resetstates(mqc_01);
    mqc_setstate(mqc_01,0x12,0,0x2e);
    mqc_setstate(mqc_01,0x11,0,3);
    mqc_setstate(mqc_01,0,0,4);
    for (local_3c = 0; local_3c < *(uint *)(in_RSI + 0x34); local_3c = local_3c + 1) {
      mqc_00 = (opj_mqc_t *)(*(long *)(in_RSI + 8) + (ulong)local_3c * 0x28);
      uVar2 = in_stack_ffffffffffffffac & 0xffffff;
      if ((local_34 <= *(int *)(in_RSI + 0x20) + -5) &&
         (uVar2 = in_stack_ffffffffffffffac & 0xffffff, local_38 < 2)) {
        uVar2 = CONCAT13((in_R8D & 1) != 0,(int3)in_stack_ffffffffffffffac);
      }
      in_stack_ffffffffffffffac = uVar2;
      cVar4 = (char)(in_stack_ffffffffffffffac >> 0x18) != '\0';
      lVar1._0_4_ = mqc_00->c;
      lVar1._4_4_ = mqc_00->a;
      if (lVar1 != 0) {
        if ((bool)cVar4) {
          raw_init_dec(raw_00,(uchar *)(**(long **)mqc_00 + (ulong)mqc_00->ct),
                       *(int *)((long)&mqc_00->bp + 4));
        }
        else {
          mqc_init_dec(mqc_00,(uchar *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                       ,0);
        }
        for (local_40 = 0; local_40 < *(uint *)&mqc_00->bp; local_40 = local_40 + 1) {
          bpno_00 = (OPJ_INT32)((ulong)raw_00 >> 0x20);
          in_stack_ffffffffffffffa8 = local_38;
          if (local_38 == 0) {
            t1_dec_sigpass((opj_t1_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),bpno_00,
                           (OPJ_UINT32)raw_00,(OPJ_BYTE)((ulong)mqc_01 >> 0x38),(OPJ_UINT32)mqc_01);
          }
          else if (local_38 == 1) {
            t1_dec_refpass((opj_t1_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),bpno_00,
                           (OPJ_BYTE)((ulong)raw_00 >> 0x18),(OPJ_UINT32)((ulong)mqc_01 >> 0x20));
          }
          else if (local_38 == 2) {
            t1_dec_clnpass(in_stack_00000060,in_stack_0000005c,in_stack_00000058,t1._4_4_);
          }
          if (((in_R8D & 2) != 0) && (cVar4 == '\0')) {
            mqc_resetstates(mqc_01);
            mqc_setstate(mqc_01,0x12,0,0x2e);
            mqc_setstate(mqc_01,0x11,0,3);
            mqc_setstate(mqc_01,0,0,4);
          }
          local_38 = local_38 + 1;
          if (local_38 == 3) {
            local_38 = 0;
            local_34 = local_34 + -1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void t1_decode_cblk_v2(
		opj_t1_t *t1,
		opj_tcd_cblk_dec_v2_t* cblk,
		OPJ_UINT32 orient,
		OPJ_UINT32 roishift,
		OPJ_UINT32 cblksty)
{
	opj_raw_t *raw = t1->raw;	/* RAW component */
	opj_mqc_t *mqc = t1->mqc;	/* MQC component */

	OPJ_INT32 bpno;
	OPJ_UINT32 passtype;
	OPJ_UINT32 segno, passno;
	OPJ_BYTE type = T1_TYPE_MQ; /* BYPASS mode */

	if(!allocate_buffers(
				t1,
				cblk->x1 - cblk->x0,
				cblk->y1 - cblk->y0))
	{
		return;
	}

	bpno = roishift + cblk->numbps - 1;
	passtype = 2;

	mqc_resetstates(mqc);
	mqc_setstate(mqc, T1_CTXNO_UNI, 0, 46);
	mqc_setstate(mqc, T1_CTXNO_AGG, 0, 3);
	mqc_setstate(mqc, T1_CTXNO_ZC, 0, 4);

	for (segno = 0; segno < cblk->real_num_segs; ++segno) {
		opj_tcd_seg_t *seg = &cblk->segs[segno];

		/* BYPASS mode */
		type = ((bpno <= ((OPJ_INT32) (cblk->numbps) - 1) - 4) && (passtype < 2) && (cblksty & J2K_CCP_CBLKSTY_LAZY)) ? T1_TYPE_RAW : T1_TYPE_MQ;
		/* FIXME: slviewer gets here with a null pointer. Why? Partially downloaded and/or corrupt textures? */
		if(seg->data == 00){
			continue;
		}
		if (type == T1_TYPE_RAW) {
			raw_init_dec(raw, (*seg->data) + seg->dataindex, seg->len);
		} else {
			mqc_init_dec(mqc, (*seg->data) + seg->dataindex, seg->len);
		}

		for (passno = 0; passno < seg->real_num_passes; ++passno) {
			switch (passtype) {
				case 0:
					t1_dec_sigpass(t1, bpno+1, orient, type, cblksty);
					break;
				case 1:
					t1_dec_refpass(t1, bpno+1, type, cblksty);
					break;
				case 2:
					t1_dec_clnpass(t1, bpno+1, orient, cblksty);
					break;
			}

			if ((cblksty & J2K_CCP_CBLKSTY_RESET) && type == T1_TYPE_MQ) {
				mqc_resetstates(mqc);
				mqc_setstate(mqc, T1_CTXNO_UNI, 0, 46);
				mqc_setstate(mqc, T1_CTXNO_AGG, 0, 3);
				mqc_setstate(mqc, T1_CTXNO_ZC, 0, 4);
			}
			if (++passtype == 3) {
				passtype = 0;
				bpno--;
			}
		}
	}
}